

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void __thiscall ImGuiMenuColumns::Update(ImGuiMenuColumns *this,int count,float spacing,bool clear)

{
  int local_20;
  int i;
  bool clear_local;
  float spacing_local;
  int count_local;
  ImGuiMenuColumns *this_local;
  
  if (count == 3) {
    this->NextWidth = 0.0;
    this->Width = 0.0;
    this->Spacing = spacing;
    if (clear) {
      memset(this->NextWidths,0,0xc);
    }
    for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
      if ((0 < local_20) && (0.0 < this->NextWidths[local_20])) {
        this->Width = this->Spacing + this->Width;
      }
      this->Pos[local_20] = (float)(int)this->Width;
      this->Width = this->NextWidths[local_20] + this->Width;
      this->NextWidths[local_20] = 0.0;
    }
    return;
  }
  __assert_fail("count == ((int)(sizeof(Pos) / sizeof(*(Pos))))",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                ,0x18fc,"void ImGuiMenuColumns::Update(int, float, bool)");
}

Assistant:

void ImGuiMenuColumns::Update(int count, float spacing, bool clear)
{
    IM_ASSERT(count == IM_ARRAYSIZE(Pos));
    IM_UNUSED(count);
    Width = NextWidth = 0.0f;
    Spacing = spacing;
    if (clear)
        memset(NextWidths, 0, sizeof(NextWidths));
    for (int i = 0; i < IM_ARRAYSIZE(Pos); i++)
    {
        if (i > 0 && NextWidths[i] > 0.0f)
            Width += Spacing;
        Pos[i] = IM_FLOOR(Width);
        Width += NextWidths[i];
        NextWidths[i] = 0.0f;
    }
}